

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O2

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::dht_direct_response_alert,libtorrent::aux::stack_allocator&,void*&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,void **args_1,
          basic_endpoint<boost::asio::ip::udp> *args_2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  _Head_base<0UL,_char_*,_false> _Var3;
  long lVar4;
  uint uVar5;
  dht_direct_response_alert *this_00;
  
  lVar4 = (long)this->m_size;
  if ((ulong)(long)this->m_capacity < lVar4 + 0x80U) {
    grow_capacity(this,0x80);
    lVar4 = (long)this->m_size;
  }
  _Var3._M_head_impl =
       (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
       super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl;
  uVar5 = -(int)(_Var3._M_head_impl + lVar4) - 0x10U & 7;
  _Var3._M_head_impl[lVar4 + 2] = (char)uVar5;
  *(code **)(_Var3._M_head_impl + lVar4 + 8) = move<libtorrent::dht_direct_response_alert>;
  this_00 = (dht_direct_response_alert *)(_Var3._M_head_impl + lVar4 + (ulong)uVar5 + 0x10);
  *(ushort *)(_Var3._M_head_impl + lVar4) = -(short)this_00 - 0x68U & 7 | 0x68;
  dht_direct_response_alert::dht_direct_response_alert(this_00,args,*args_1,args_2);
  uVar1 = this->m_size;
  uVar2 = this->m_num_items;
  this->m_size = uVar5 + 0x10 + (uint)*(ushort *)(_Var3._M_head_impl + lVar4) + uVar1;
  this->m_num_items = uVar2 + 1;
  return this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U),  alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
			return *ret;
		}